

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QStaticPlugin>::copyAppend
          (QPodArrayOps<QStaticPlugin> *this,QStaticPlugin *b,QStaticPlugin *e)

{
  qsizetype *pqVar1;
  
  if (b != e) {
    memcpy((this->super_QArrayDataPointer<QStaticPlugin>).ptr +
           (this->super_QArrayDataPointer<QStaticPlugin>).size,b,(long)e - (long)b);
    pqVar1 = &(this->super_QArrayDataPointer<QStaticPlugin>).size;
    *pqVar1 = *pqVar1 + ((long)e - (long)b) / 0x18;
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e) noexcept
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        ::memcpy(static_cast<void *>(this->end()), static_cast<const void *>(b), (e - b) * sizeof(T));
        this->size += (e - b);
    }